

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inline.cpp
# Opt level: O0

bool __thiscall Inline::IsArgumentsOpnd(Inline *this,Opnd *opnd)

{
  bool bVar1;
  StackSym *pSVar2;
  Instr *this_00;
  Opnd *local_30;
  Opnd *local_28;
  Opnd *checkOpnd;
  Opnd *opnd_local;
  Inline *this_local;
  
  local_28 = opnd;
  do {
    if (local_28 == (Opnd *)0x0) {
      return false;
    }
    bVar1 = IR::Opnd::IsArgumentsObject(local_28);
    if (bVar1) {
      return true;
    }
    pSVar2 = IR::Opnd::GetStackSym(local_28);
    if (pSVar2 == (StackSym *)0x0) {
LAB_00725bf9:
      local_30 = (Opnd *)0x0;
    }
    else {
      pSVar2 = IR::Opnd::GetStackSym(local_28);
      bVar1 = StackSym::IsSingleDef(pSVar2);
      if (!bVar1) goto LAB_00725bf9;
      pSVar2 = IR::Opnd::GetStackSym(local_28);
      this_00 = StackSym::GetInstrDef(pSVar2);
      local_30 = IR::Instr::GetSrc1(this_00);
    }
    local_28 = local_30;
  } while( true );
}

Assistant:

bool
Inline::IsArgumentsOpnd(IR::Opnd* opnd)
{
    IR::Opnd * checkOpnd = opnd;
    while (checkOpnd)
    {
        if (checkOpnd->IsArgumentsObject())
        {
            return true;
        }
        checkOpnd = checkOpnd->GetStackSym() && checkOpnd->GetStackSym()->IsSingleDef() ? checkOpnd->GetStackSym()->GetInstrDef()->GetSrc1() : nullptr;
    }

    return false;
}